

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::save_load_memory_tree(memory_tree *b,io_buf *model_file,bool read,bool text)

{
  v_array<memory_tree_ns::node> *this;
  vw *pvVar1;
  memory_tree *pmVar2;
  ostream *poVar3;
  undefined7 in_register_00000011;
  uint32_t *puVar4;
  uint32_t i;
  ulong uVar5;
  v_array<example_*> *this_00;
  uint uVar6;
  bool text_local;
  bool read_local;
  size_t n_nodes;
  undefined4 local_22c;
  uint local_228;
  uint local_224;
  memory_tree *local_220;
  int *local_218;
  example *new_ec;
  size_t n_examples;
  uint32_t uStack_200;
  uint32_t uStack_1fc;
  uint32_t local_1f8;
  uint32_t uStack_1f4;
  double local_1f0;
  double dStack_1e8;
  uint *local_1e0;
  uint *puStack_1d8;
  uint *local_1d0;
  size_t sStack_1c8;
  stringstream msg;
  ostream local_1a8;
  
  text_local = text;
  read_local = read;
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  if ((model_file->files)._end != (model_file->files)._begin) {
    if (read) {
      b->test_mode = true;
      n_examples = 0;
      poVar3 = std::operator<<(&local_1a8,"stride_shift");
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," ");
      bin_text_read_write_fixed(model_file,(char *)&n_examples,8,"",true,&msg,text);
      parameters::stride_shift(&b->all->weights,(uint32_t)n_examples);
    }
    else {
      pvVar1 = b->all;
      puVar4 = &(pvVar1->weights).dense_weights._stride_shift;
      if ((pvVar1->weights).sparse != false) {
        puVar4 = &(pvVar1->weights).sparse_weights._stride_shift;
      }
      n_examples = (size_t)*puVar4;
      poVar3 = std::operator<<(&local_1a8,"stride_shift");
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," ");
      bin_text_read_write_fixed(model_file,(char *)&n_examples,8,"",false,&msg,text);
    }
    poVar3 = std::operator<<(&local_1a8,"max_nodes");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed(model_file,(char *)&b->max_nodes,8,"",read,&msg,text);
    poVar3 = std::operator<<(&local_1a8,"learn_at_leaf");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,b->learn_at_leaf);
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed(model_file,(char *)&b->learn_at_leaf,4,"",read,&msg,text);
    poVar3 = std::operator<<(&local_1a8,"oas");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,b->oas);
    std::operator<<(poVar3," ");
    local_218 = &b->oas;
    bin_text_read_write_fixed(model_file,(char *)local_218,4,"",read,&msg,text);
    n_nodes = ((long)(b->nodes)._end - (long)(b->nodes)._begin) / 0x48;
    poVar3 = std::operator<<(&local_1a8,"nodes");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed(model_file,(char *)&n_nodes,8,"",read,&msg,text);
    poVar3 = std::operator<<(&local_1a8,"max_number_of_labels");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed(model_file,(char *)&b->max_num_labels,8,"",read,&msg,text);
    this = &b->nodes;
    local_22c = (undefined4)CONCAT71(in_register_00000011,read);
    local_228 = (uint)read;
    local_224 = (uint)text;
    if (read) {
      v_array<memory_tree_ns::node>::clear(this);
      for (uVar5 = 0; uVar5 < n_nodes; uVar5 = (ulong)((int)uVar5 + 1)) {
        local_1f8 = 0;
        uStack_1f4 = 0;
        n_examples = 0;
        uStack_200 = 0;
        uStack_1fc = 0;
        local_1f0 = 0.001;
        dStack_1e8 = 0.001;
        local_1d0 = (uint *)0x0;
        sStack_1c8 = 0;
        local_1e0 = (uint *)0x0;
        puStack_1d8 = (uint *)0x0;
        v_array<memory_tree_ns::node>::push_back(this,(node *)&n_examples);
      }
    }
    local_220 = b;
    for (uVar6 = 0; pmVar2 = local_220, uVar6 < n_nodes; uVar6 = uVar6 + 1) {
      save_load_node(this->_begin + uVar6,model_file,&read_local,&text_local,&msg);
    }
    n_examples = (long)(local_220->examples)._end - (long)(local_220->examples)._begin >> 3;
    poVar3 = std::operator<<(&local_1a8,"examples");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," ");
    bin_text_read_write_fixed
              (model_file,(char *)&n_examples,8,"",SUB41(local_228,0),&msg,SUB41(local_224,0));
    this_00 = &pmVar2->examples;
    if ((char)local_22c != '\0') {
      v_array<example_*>::clear(this_00);
      for (uVar5 = 0; uVar5 < n_examples; uVar5 = (ulong)((int)uVar5 + 1)) {
        new_ec = calloc_or_throw<example>();
        v_array<example_*>::push_back(this_00,&new_ec);
      }
    }
    for (uVar6 = 0; uVar6 < n_examples; uVar6 = uVar6 + 1) {
      save_load_example(this_00->_begin[uVar6],model_file,&read_local,&text_local,&msg,local_218);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  return;
}

Assistant:

void save_load_memory_tree(memory_tree& b, io_buf& model_file, bool read, bool text)
    {
        stringstream msg;
        if (model_file.files.size() > 0){
            if (read)
                b.test_mode = true;

            if (read)
            {
                size_t ss = 0;
                writeit(ss, "stride_shift");
                b.all->weights.stride_shift(ss);
            }
            else
            {
                size_t ss = b.all->weights.stride_shift();
                writeit(ss, "stride_shift");
            }
            
            writeit(b.max_nodes, "max_nodes");
            writeit(b.learn_at_leaf, "learn_at_leaf");
            writeit(b.oas, "oas");
	        //writeit(b.leaf_example_multiplier, "leaf_example_multiplier")
            writeitvar(b.nodes.size(), "nodes", n_nodes); 
            writeit(b.max_num_labels, "max_number_of_labels");

            if (read){
                b.nodes.clear();
                for (uint32_t i = 0; i < n_nodes; i++)
                    b.nodes.push_back(node());
            }
            
            //node  
            for(uint32_t i = 0; i < n_nodes; i++){
                save_load_node(b.nodes[i], model_file, read, text, msg);
            }
            //deal with examples:
            writeitvar(b.examples.size(), "examples", n_examples);
            if (read){
                b.examples.clear();
                for (uint32_t i = 0; i < n_examples; i++){
                    example* new_ec = &calloc_or_throw<example>();
                    b.examples.push_back(new_ec);
                }
            }
            for (uint32_t i = 0; i < n_examples; i++)
                save_load_example(b.examples[i], model_file, read, text, msg, b.oas);
	    //cout<<"done loading...."<<endl;
            
            
        }
    }